

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  ImDrawChannel *pIVar7;
  void *pvVar8;
  ImVec4 *pIVar9;
  ImDrawChannel *__dest;
  long lVar10;
  void *pvVar11;
  void *__dest_00;
  char *__function;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  
  if ((this->_ChannelsCurrent != 0) || (this->_ChannelsCount != 1)) {
    __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x114,"void ImDrawList::ChannelsSplit(int)");
  }
  iVar6 = (this->_Channels).Size;
  if (iVar6 < channels_count) {
    iVar15 = (this->_Channels).Capacity;
    if (iVar15 < channels_count) {
      if (iVar15 == 0) {
        iVar17 = 8;
      }
      else {
        iVar17 = iVar15 / 2 + iVar15;
      }
      if (iVar17 <= channels_count) {
        iVar17 = channels_count;
      }
      if (iVar15 < iVar17) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar17 << 5);
        pIVar7 = (this->_Channels).Data;
        if (pIVar7 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar7,(long)(this->_Channels).Size << 5);
        }
        ImGui::MemFree((this->_Channels).Data);
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar17;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_ChannelsCount = channels_count;
  if ((this->_Channels).Size < 1) {
LAB_0013e2d7:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x35b,"value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]")
    ;
  }
  pIVar7 = (this->_Channels).Data;
  (pIVar7->IdxBuffer).Size = 0;
  (pIVar7->IdxBuffer).Capacity = 0;
  (pIVar7->IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar7->CmdBuffer).Size = 0;
  (pIVar7->CmdBuffer).Capacity = 0;
  (pIVar7->CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar16 = 1;
    lVar13 = 0x38;
    do {
      lVar10 = (long)(this->_Channels).Size;
      if ((long)uVar16 < (long)iVar6) {
        if (lVar10 <= (long)uVar16) goto LAB_0013e2d7;
        pIVar7 = (this->_Channels).Data;
        iVar15 = *(int *)((long)pIVar7 + lVar13 + -0x14);
        if (iVar15 < 0) {
          uVar14 = iVar15 / 2 + iVar15;
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          pvVar11 = ImGui::MemAlloc((ulong)uVar14 * 0x30);
          pvVar8 = *(void **)((long)pIVar7 + lVar13 + -0x10);
          if (pvVar8 != (void *)0x0) {
            memcpy(pvVar11,pvVar8,(long)*(int *)((long)pIVar7 + lVar13 + -0x18) * 0x30);
          }
          ImGui::MemFree(*(void **)((long)pIVar7 + lVar13 + -0x10));
          *(void **)((long)pIVar7 + lVar13 + -0x10) = pvVar11;
          *(uint *)((long)pIVar7 + lVar13 + -0x14) = uVar14;
        }
        *(undefined4 *)((long)pIVar7 + lVar13 + -0x18) = 0;
        if ((long)(this->_Channels).Size <= (long)uVar16) goto LAB_0013e2d7;
        pIVar7 = (this->_Channels).Data;
        iVar15 = *(int *)((long)pIVar7 + lVar13 + -4);
        if (iVar15 < 0) {
          iVar15 = iVar15 / 2 + iVar15;
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          pvVar11 = ImGui::MemAlloc((ulong)(uint)(iVar15 * 2));
          pvVar8 = *(void **)((long)&(pIVar7->CmdBuffer).Size + lVar13);
          if (pvVar8 != (void *)0x0) {
            memcpy(pvVar11,pvVar8,(long)*(int *)((long)pIVar7 + lVar13 + -8) * 2);
          }
          ImGui::MemFree(*(void **)((long)&(pIVar7->CmdBuffer).Size + lVar13));
          *(void **)((long)&(pIVar7->CmdBuffer).Size + lVar13) = pvVar11;
          *(int *)((long)pIVar7 + lVar13 + -4) = iVar15;
        }
        *(undefined4 *)((long)pIVar7 + lVar13 + -8) = 0;
      }
      else {
        if (lVar10 <= (long)uVar16) goto LAB_0013e2d7;
        pIVar7 = (this->_Channels).Data;
        puVar1 = (undefined8 *)((long)pIVar7 + lVar13 + -8);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar7 + lVar13 + -0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      if ((long)(this->_Channels).Size <= (long)uVar16) goto LAB_0013e2d7;
      pIVar7 = (this->_Channels).Data;
      if (*(int *)((long)pIVar7 + lVar13 + -0x18) == 0) {
        lVar10 = (long)(this->_ClipRectStack).Size;
        if (lVar10 < 1) {
          __function = "value_type &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_0013e322:
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                        ,0x365,__function);
        }
        lVar12 = (long)(this->_TextureIdStack).Size;
        if (lVar12 < 1) {
          __function = "value_type &ImVector<void *>::back() [T = void *]";
          goto LAB_0013e322;
        }
        pIVar9 = (this->_ClipRectStack).Data;
        fVar2 = pIVar9[lVar10 + -1].x;
        fVar3 = pIVar9[lVar10 + -1].y;
        fVar4 = pIVar9[lVar10 + -1].z;
        fVar5 = pIVar9[lVar10 + -1].w;
        pvVar8 = (this->_TextureIdStack).Data[lVar12 + -1];
        if (*(int *)((long)pIVar7 + lVar13 + -0x14) == 0) {
          __dest_00 = ImGui::MemAlloc(0x180);
          pvVar11 = *(void **)((long)pIVar7 + lVar13 + -0x10);
          if (pvVar11 != (void *)0x0) {
            memcpy(__dest_00,pvVar11,(long)*(int *)((long)pIVar7 + lVar13 + -0x18) * 0x30);
          }
          ImGui::MemFree(*(void **)((long)pIVar7 + lVar13 + -0x10));
          *(void **)((long)pIVar7 + lVar13 + -0x10) = __dest_00;
          *(undefined4 *)((long)pIVar7 + lVar13 + -0x14) = 8;
        }
        lVar10 = *(long *)((long)pIVar7 + lVar13 + -0x10);
        iVar15 = *(int *)((long)pIVar7 + lVar13 + -0x18);
        *(int *)((long)pIVar7 + lVar13 + -0x18) = iVar15 + 1;
        lVar12 = (long)iVar15 * 0x30;
        *(undefined4 *)(lVar10 + lVar12) = 0;
        *(float *)(lVar10 + 4 + lVar12) = fVar2;
        *(float *)(lVar10 + 8 + lVar12) = fVar3;
        *(float *)(lVar10 + 0xc + lVar12) = fVar4;
        *(float *)(lVar10 + 0x10 + lVar12) = fVar5;
        *(void **)(lVar10 + 0x18 + lVar12) = pvVar8;
        puVar1 = (undefined8 *)(lVar10 + 0x20 + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      uVar16 = uVar16 + 1;
      lVar13 = lVar13 + 0x20;
    } while ((uint)channels_count != uVar16);
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}